

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.c
# Opt level: O0

char * al_get_config_value(ALLEGRO_CONFIG *config,char *section,char *key)

{
  _Bool _Var1;
  ALLEGRO_USTR *key_00;
  ALLEGRO_USTR *ret_value;
  ALLEGRO_USTR *value;
  ALLEGRO_USTR *ukey;
  ALLEGRO_USTR *usection;
  ALLEGRO_USTR_INFO key_info;
  ALLEGRO_USTR_INFO section_info;
  ALLEGRO_USTR *local_58;
  char *in_stack_ffffffffffffffb8;
  ALLEGRO_USTR *in_stack_ffffffffffffffc0;
  ALLEGRO_CONFIG *in_stack_ffffffffffffffc8;
  char *local_8;
  
  key_00 = al_ref_cstr(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  ret_value = al_ref_cstr(in_stack_ffffffffffffffc0,(char *)key_00);
  _Var1 = config_get_value(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,key_00,
                           (ALLEGRO_USTR **)ret_value);
  if (_Var1) {
    local_8 = al_cstr(local_58);
  }
  else {
    local_8 = (char *)0x0;
  }
  return local_8;
}

Assistant:

const char *al_get_config_value(const ALLEGRO_CONFIG *config,
   const char *section, const char *key)
{
   ALLEGRO_USTR_INFO section_info;
   ALLEGRO_USTR_INFO key_info;
   const ALLEGRO_USTR *usection;
   const ALLEGRO_USTR *ukey;
   const ALLEGRO_USTR *value;

   if (section == NULL) {
      section = "";
   }

   usection = al_ref_cstr(&section_info, section);
   ukey = al_ref_cstr(&key_info, key);

   if (config_get_value(config, usection, ukey, &value))
      return al_cstr(value);
   else
      return NULL;
}